

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourcesDictionary.cpp
# Opt level: O2

string * __thiscall
ResourcesDictionary::AddImageXObjectMapping_abi_cxx11_
          (string *__return_storage_ptr__,ResourcesDictionary *this,ObjectIDType inImageXObjectID)

{
  iterator iVar1;
  string *newName_1;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar2;
  string newName;
  pointer local_78;
  undefined1 local_70 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  
  local_78 = (pointer)inImageXObjectID;
  if (inImageXObjectID == 0) {
    local_48._M_dataplus._M_p = (pointer)(this->mImageXObjectsCount + 1);
    BoxingBaseWithRW<unsigned_long,STDStreamsReader<unsigned_long>,STDStreamsWriter<unsigned_long>>
    ::ToString_abi_cxx11_((string *)local_70,&local_48);
    std::operator+(__return_storage_ptr__,&scIM_abi_cxx11_,(string *)local_70);
    std::__cxx11::string::~string((string *)local_70);
    this->mImageXObjectsCount = this->mImageXObjectsCount + 1;
  }
  else {
    iVar1 = std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(this->mXObjects)._M_t,(key_type *)&local_78);
    if ((_Rb_tree_header *)iVar1._M_node == &(this->mXObjects)._M_t._M_impl.super__Rb_tree_header) {
      local_28 = this->mImageXObjectsCount + 1;
      BoxingBaseWithRW<unsigned_long,STDStreamsReader<unsigned_long>,STDStreamsWriter<unsigned_long>>
      ::ToString_abi_cxx11_((string *)local_70,&local_28);
      std::operator+(&local_48,&scIM_abi_cxx11_,(string *)local_70);
      std::__cxx11::string::~string((string *)local_70);
      this->mImageXObjectsCount = this->mImageXObjectsCount + 1;
      local_70._0_8_ = local_78;
      std::__cxx11::string::string((string *)(local_70 + 8),(string *)&local_48);
      pVar2 = std::
              _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
              ::_M_insert_unique<std::pair<unsigned_long_const,std::__cxx11::string>>
                        ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
                          *)&this->mXObjects,
                         (pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_70);
      iVar1._M_node = (_Base_ptr)pVar2.first._M_node;
      std::__cxx11::string::~string((string *)(local_70 + 8));
      std::__cxx11::string::~string((string *)&local_48);
    }
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&iVar1._M_node[1]._M_parent);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ResourcesDictionary::AddImageXObjectMapping(ObjectIDType inImageXObjectID)
{
    if(inImageXObjectID == 0)
    {
        std::string newName = scIM + ULong(mImageXObjectsCount+1).ToString();
        ++mImageXObjectsCount;
        return newName;
    }
    else 
    {
        ObjectIDTypeToStringMap::iterator it = mXObjects.find(inImageXObjectID);
        
        if(it == mXObjects.end())
        {
            std::string newName = scIM + ULong(mImageXObjectsCount+1).ToString();
            ++mImageXObjectsCount;
            it = mXObjects.insert(ObjectIDTypeToStringMap::value_type(inImageXObjectID,newName)).first;
        }
        return it->second;
    }
}